

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap_allocator.h
# Opt level: O1

pointer __thiscall
tcmalloc::STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::allocate
          (STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void> *this,size_type n,
          void *param_2)

{
  LogItem b;
  LogItem c;
  LogItem d;
  Entry *pEVar1;
  undefined4 uStack_44;
  anon_union_8_4_e5b1a622_for_u_ aStack_40;
  undefined4 uStack_34;
  anon_union_8_4_e5b1a622_for_u_ aStack_30;
  undefined4 uStack_24;
  anon_union_8_4_e5b1a622_for_u_ aStack_20;
  
  if (!underlying_.initialized) {
    underlying_.allocator.free_list_._0_4_ = 0;
    underlying_.allocator.free_list_._4_4_ = 0;
    underlying_.allocator.inuse_ = 0;
    underlying_.allocator.free_area_ = (char *)0x0;
    underlying_.allocator.free_avail_._0_4_ = 0;
    underlying_.allocator.free_avail_._4_4_ = 0;
    pEVar1 = PageHeapAllocator<tcmalloc::StackTraceTable::Entry>::New(&underlying_.allocator);
    pEVar1->next = (Entry *)CONCAT44(underlying_.allocator.free_list_._4_4_,
                                     underlying_.allocator.free_list_._0_4_);
    underlying_.allocator.free_list_._0_4_ = SUB84(pEVar1,0);
    underlying_.allocator.free_list_._4_4_ = (undefined4)((ulong)pEVar1 >> 0x20);
    underlying_.allocator.inuse_ = underlying_.allocator.inuse_ + -1;
    underlying_.initialized = true;
  }
  if (n == 1) {
    pEVar1 = PageHeapAllocator<tcmalloc::StackTraceTable::Entry>::New(&underlying_.allocator);
    return pEVar1;
  }
  d._4_4_ = uStack_24;
  d.tag_ = 4;
  c._4_4_ = uStack_34;
  c.tag_ = 4;
  b._4_4_ = uStack_44;
  b.tag_ = 4;
  b.u_.str = aStack_40.str;
  c.u_.str = aStack_30.str;
  d.u_.str = aStack_20.str;
  Log(kCrash,
      "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap_allocator.h"
      ,0xa2,(LogItem)(ZEXT816(0x136a7f) << 0x40),b,c,d);
  do {
  } while( true );
}

Assistant:

pointer allocate(size_type n, const void* = 0) {
    if (!underlying_.initialized) {
      underlying_.allocator.Init();
      underlying_.initialized = true;
    }

    CHECK_CONDITION(n == 1);
    return underlying_.allocator.New();
  }